

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separator.cpp
# Opt level: O1

void __thiscall ftxui::SeparatorWithPixel::Render(SeparatorWithPixel *this,Screen *screen)

{
  bool bVar1;
  Color CVar2;
  Pixel *pPVar3;
  int x;
  int y;
  
  y = (this->super_Separator).super_Node.box_.y_min;
  if (y <= (this->super_Separator).super_Node.box_.y_max) {
    do {
      x = (this->super_Separator).super_Node.box_.x_min;
      if (x <= (this->super_Separator).super_Node.box_.x_max) {
        do {
          pPVar3 = Screen::PixelAt(screen,x,y);
          std::__cxx11::string::_M_assign((string *)pPVar3);
          pPVar3->field_0x28 = (this->pixel_).field_0x28;
          CVar2 = (this->pixel_).foreground_color;
          pPVar3->background_color = (this->pixel_).background_color;
          pPVar3->foreground_color = CVar2;
          bVar1 = x < (this->super_Separator).super_Node.box_.x_max;
          x = x + 1;
        } while (bVar1);
      }
      bVar1 = y < (this->super_Separator).super_Node.box_.y_max;
      y = y + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    for (int y = box_.y_min; y <= box_.y_max; ++y) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, y) = pixel_;
      }
    }
  }